

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep_nls.c
# Opt level: O0

int arkStep_NlsResidual_MassIdent_TrivialPredAutonomous(N_Vector zcor,N_Vector r,void *arkode_mem)

{
  int iVar1;
  undefined8 in_RSI;
  undefined8 in_RDI;
  N_Vector X [3];
  sunrealtype c [3];
  int nls_iter;
  int retval;
  ARKodeARKStepMem step_mem;
  ARKodeMem ark_mem;
  ARKodeMem *in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  void *in_stack_ffffffffffffff98;
  undefined8 local_58;
  undefined8 local_50;
  ulong local_48;
  int local_38;
  int local_34;
  long local_30;
  long local_28;
  undefined8 local_18;
  undefined8 local_10;
  int local_4;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_34 = arkStep_AccessARKODEStepMem
                       (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                        in_stack_ffffffffffffff88,(ARKodeARKStepMem *)0x124a3e);
  local_4 = local_34;
  if (local_34 == 0) {
    N_VLinearSum(*(undefined8 *)(local_30 + 0x50),local_10,*(undefined8 *)(local_28 + 0x248));
    local_34 = SUNNonlinSolGetCurIter(*(undefined8 *)(local_30 + 0x88),&local_38);
    if (local_34 == 0) {
      if ((local_38 == 0) && (*(long *)(local_30 + 0x118) != 0)) {
        N_VScale(0x3ff0000000000000,*(undefined8 *)(local_30 + 0x118),
                 *(undefined8 *)(*(long *)(local_30 + 0x38) + (long)*(int *)(local_30 + 0x68) * 8));
      }
      else {
        local_34 = (**(code **)(local_30 + 0x98))
                             (*(undefined8 *)(local_28 + 0x2f0),*(undefined8 *)(local_28 + 0x248),
                              *(undefined8 *)
                               (*(long *)(local_30 + 0x38) + (long)*(int *)(local_30 + 0x68) * 8),
                              *(undefined8 *)(local_28 + 0x10));
        *(long *)(local_30 + 400) = *(long *)(local_30 + 400) + 1;
        if (local_34 < 0) {
          return -8;
        }
        if (0 < local_34) {
          return 9;
        }
      }
      local_58 = 0x3ff0000000000000;
      local_50 = 0xbff0000000000000;
      local_48 = *(ulong *)(local_30 + 0xa0) ^ 0x8000000000000000;
      iVar1 = N_VLinearCombination(3,&local_58,&stack0xffffffffffffff88,local_18);
      if (iVar1 == 0) {
        local_4 = 0;
      }
      else {
        local_4 = -0x1c;
      }
    }
    else {
      local_4 = -0x20;
    }
  }
  return local_4;
}

Assistant:

int arkStep_NlsResidual_MassIdent_TrivialPredAutonomous(N_Vector zcor, N_Vector r,
                                                        void* arkode_mem)
{
  /* temporary variables */
  ARKodeMem ark_mem;
  ARKodeARKStepMem step_mem;
  int retval, nls_iter;
  sunrealtype c[3];
  N_Vector X[3];

  /* access ARKodeMem and ARKodeARKStepMem structures */
  retval = arkStep_AccessARKODEStepMem(arkode_mem, __func__, &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* update 'ycur' value as stored predictor + current corrector */
  N_VLinearSum(ONE, step_mem->zpred, ONE, zcor, ark_mem->ycur);

  /* compute implicit RHS if not already available */
  retval = SUNNonlinSolGetCurIter(step_mem->NLS, &nls_iter);
  if (retval != ARK_SUCCESS) { return ARK_NLS_OP_ERR; }

  if (nls_iter == 0 && step_mem->fn_implicit)
  {
    N_VScale(ONE, step_mem->fn_implicit, step_mem->Fi[step_mem->istage]);
  }
  else
  {
    retval = step_mem->nls_fi(ark_mem->tcur, ark_mem->ycur,
                              step_mem->Fi[step_mem->istage], ark_mem->user_data);
    step_mem->nfi++;
    if (retval < 0) { return (ARK_RHSFUNC_FAIL); }
    if (retval > 0) { return (RHSFUNC_RECVR); }
  }

  /* compute residual via linear combination */
  c[0]   = ONE;
  X[0]   = zcor;
  c[1]   = -ONE;
  X[1]   = step_mem->sdata;
  c[2]   = -step_mem->gamma;
  X[2]   = step_mem->Fi[step_mem->istage];
  retval = N_VLinearCombination(3, c, X, r);
  if (retval != 0) { return (ARK_VECTOROP_ERR); }
  return (ARK_SUCCESS);
}